

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlocale.cpp
# Opt level: O2

double __thiscall
QLocaleData::stringToDouble(QLocaleData *this,QStringView str,bool *ok,NumberOptions number_options)

{
  bool bVar1;
  long in_FS_OFFSET;
  QSimpleParsedNumber<double> QVar2;
  double local_158;
  CharBuff local_150;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  memset(&local_150.super_QVLAStorage<1UL,_1UL,_256LL>,0xaa,0x100);
  local_150.super_QVLABase<char>.super_QVLABaseBase.a = 0x100;
  local_150.super_QVLABase<char>.super_QVLABaseBase.s = 0;
  local_150.super_QVLABase<char>.super_QVLABaseBase.ptr =
       &local_150.super_QVLAStorage<1UL,_1UL,_256LL>;
  bVar1 = numberToCLocale(this,str,number_options,DoubleScientificMode,&local_150);
  if (bVar1) {
    QVar2 = qt_asciiToDouble((char *)local_150.super_QVLABase<char>.super_QVLABaseBase.ptr,
                             local_150.super_QVLABase<char>.super_QVLABaseBase.s + -1,
                             TrailingJunkProhibited);
    local_158 = QVar2.result;
    if (ok == (bool *)0x0) goto LAB_002da355;
    bVar1 = 0 < QVar2.used;
  }
  else {
    local_158 = 0.0;
    if (ok == (bool *)0x0) goto LAB_002da355;
    bVar1 = false;
  }
  *ok = bVar1;
LAB_002da355:
  QVarLengthArray<char,_256LL>::~QVarLengthArray(&local_150);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return local_158;
}

Assistant:

double QLocaleData::stringToDouble(QStringView str, bool *ok,
                                   QLocale::NumberOptions number_options) const
{
    CharBuff buff;
    if (!numberToCLocale(str, number_options, DoubleScientificMode, &buff)) {
        if (ok != nullptr)
            *ok = false;
        return 0.0;
    }
    auto r = qt_asciiToDouble(buff.constData(), buff.size() - 1);
    if (ok != nullptr)
        *ok = r.ok();
    return r.result;
}